

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O3

bool __thiscall
r_comp::Compiler::read_nil_us
          (Compiler *this,Ptr *node,uint16_t write_index,uint16_t *extent_index,bool write)

{
  ushort uVar1;
  ImageObject *pIVar2;
  int iVar3;
  Atom *pAVar4;
  Atom local_2c [4];
  
  iVar3 = std::__cxx11::string::compare
                    ((char *)&((node->
                               super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr)->cmd);
  if (iVar3 == 0 && write) {
    r_code::Atom::IPointer((ushort)local_2c);
    pAVar4 = r_code::vector<r_code::Atom>::operator[]
                       ((vector<r_code::Atom> *)(this->current_object + 8),(ulong)write_index);
    r_code::Atom::operator=(pAVar4,local_2c);
    r_code::Atom::~Atom(local_2c);
    r_code::Atom::UndefinedTimestamp();
    pIVar2 = this->current_object;
    uVar1 = *extent_index;
    *extent_index = uVar1 + 1;
    pAVar4 = r_code::vector<r_code::Atom>::operator[]
                       ((vector<r_code::Atom> *)(pIVar2 + 8),(ulong)uVar1);
    r_code::Atom::operator=(pAVar4,local_2c);
    r_code::Atom::~Atom(local_2c);
    r_code::Atom::Atom(local_2c,0xffffffff);
    pIVar2 = this->current_object;
    uVar1 = *extent_index;
    *extent_index = uVar1 + 1;
    pAVar4 = r_code::vector<r_code::Atom>::operator[]
                       ((vector<r_code::Atom> *)(pIVar2 + 8),(ulong)uVar1);
    r_code::Atom::operator=(pAVar4,local_2c);
    r_code::Atom::~Atom(local_2c);
    r_code::Atom::Atom(local_2c,0xffffffff);
    pIVar2 = this->current_object;
    uVar1 = *extent_index;
    *extent_index = uVar1 + 1;
    pAVar4 = r_code::vector<r_code::Atom>::operator[]
                       ((vector<r_code::Atom> *)(pIVar2 + 8),(ulong)uVar1);
    r_code::Atom::operator=(pAVar4,local_2c);
    r_code::Atom::~Atom(local_2c);
  }
  return iVar3 == 0;
}

Assistant:

bool Compiler::read_nil_us(RepliStruct::Ptr node, uint16_t write_index, uint16_t &extent_index, bool write)
{
    if (node->cmd == "|ms") {
        if (write) {
            current_object->code[write_index] = Atom::IPointer(extent_index);
            current_object->code[extent_index++] = Atom::UndefinedTimestamp();
            current_object->code[extent_index++] = UINT32_MAX;
            current_object->code[extent_index++] = UINT32_MAX;
        }

        return true;
    }

    return false;
}